

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Maybe<const_kj::ReadableDirectory_&> __thiscall
capnp::compiler::CompilerMain::getSourceDirectory
          (CompilerMain *this,StringPtr pathStr,bool isSourcePrefix)

{
  ReadableDirectory **value;
  PathPtr other;
  StringPtr pathText;
  bool bVar1;
  int iVar2;
  Filesystem *pFVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  RefOrVoid<const_kj::ReadableDirectory> t;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Own<const_kj::ReadableDirectory> *pOVar5;
  ReadableDirectory *pRVar6;
  Path *pPVar7;
  String *pSVar8;
  size_t extraout_RDX;
  StringPtr *params;
  byte local_1c9;
  String local_190;
  undefined1 local_171 [17];
  undefined1 local_160 [8];
  String prefix;
  Path local_130;
  ReadableDirectory *local_118;
  ReadableDirectory *result_1;
  size_t local_108;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> local_100;
  undefined1 local_f0 [8];
  OwnOwn<const_kj::ReadableDirectory> dir;
  Path local_c8;
  undefined1 local_b0 [8];
  Own<const_kj::ReadableDirectory> fakeOwn;
  Directory *result;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> local_88;
  SourceDirectory *local_80;
  SourceDirectory *sdir;
  CompilerMain *local_68;
  char *pcStack_60;
  undefined1 local_58 [8];
  Path path;
  PathPtr cwd;
  bool isSourcePrefix_local;
  CompilerMain *this_local;
  StringPtr pathStr_local;
  
  pathStr_local.content.ptr = (char *)pathStr.content.size_;
  this_local = (CompilerMain *)pathStr.content.ptr;
  pFVar3 = kj::Own<kj::Filesystem>::operator->(&this->disk);
  iVar2 = (*pFVar3->_vptr_Filesystem[2])();
  path.parts.disposer = (ArrayDisposer *)CONCAT44(extraout_var,iVar2);
  local_68 = this_local;
  pcStack_60 = pathStr_local.content.ptr;
  pathText.content.size_ = (size_t)pathStr_local.content.ptr;
  pathText.content.ptr = (char *)this_local;
  kj::PathPtr::evalNative((Path *)local_58,(PathPtr *)&path.parts.disposer,pathText);
  sVar4 = kj::Path::size((Path *)local_58);
  if (sVar4 == 0) {
    pFVar3 = kj::Own<kj::Filesystem>::operator->(&this->disk);
    iVar2 = (**pFVar3->_vptr_Filesystem)();
    kj::Maybe<const_kj::ReadableDirectory_&>::Maybe
              ((Maybe<const_kj::ReadableDirectory_&> *)&pathStr_local.content.size_,
               (ReadableDirectory *)CONCAT44(extraout_var_00,iVar2));
    sdir._0_4_ = 1;
  }
  else {
    local_88 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::Path&>
                         ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)
                          &this->sourceDirectories,(Path *)local_58);
    local_80 = kj::_::readMaybe<capnp::compiler::CompilerMain::SourceDirectory>(&local_88);
    if (local_80 == (SourceDirectory *)0x0) {
      other.parts.size_ = extraout_RDX;
      other.parts.ptr = (String *)path.parts.disposer;
      bVar1 = kj::Path::operator==((Path *)local_58,other);
      if (bVar1) {
        pFVar3 = kj::Own<kj::Filesystem>::operator->(&this->disk);
        iVar2 = (*pFVar3->_vptr_Filesystem[1])();
        fakeOwn.ptr = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar2);
        if (isSourcePrefix) {
          kj::Own<const_kj::ReadableDirectory>::Own
                    ((Own<const_kj::ReadableDirectory> *)local_b0,fakeOwn.ptr,
                     (Disposer *)&kj::NullDisposer::instance);
          pPVar7 = kj::mv<kj::Path>((Path *)local_58);
          kj::Path::Path(&local_c8,pPVar7);
          pOVar5 = kj::mv<kj::Own<kj::ReadableDirectory_const>>
                             ((Own<const_kj::ReadableDirectory> *)local_b0);
          value = &dir.value.ptr;
          kj::Own<const_kj::ReadableDirectory>::Own
                    ((Own<const_kj::ReadableDirectory> *)value,pOVar5);
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (&this->sourceDirectories,&local_c8,(SourceDirectory *)value);
          SourceDirectory::~SourceDirectory((SourceDirectory *)&dir.value.ptr);
          kj::Path::~Path(&local_c8);
          kj::Own<const_kj::ReadableDirectory>::~Own((Own<const_kj::ReadableDirectory> *)local_b0);
        }
        kj::Maybe<const_kj::ReadableDirectory_&>::Maybe
                  ((Maybe<const_kj::ReadableDirectory_&> *)&pathStr_local.content.size_,fakeOwn.ptr)
        ;
        sdir._0_4_ = 1;
      }
      else {
        pFVar3 = kj::Own<kj::Filesystem>::operator->(&this->disk);
        iVar2 = (**pFVar3->_vptr_Filesystem)();
        kj::PathPtr::PathPtr((PathPtr *)&result_1,(Path *)local_58);
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))
                  (&local_100,(long *)CONCAT44(extraout_var_02,iVar2),result_1,local_108);
        kj::_::readMaybe<kj::ReadableDirectory_const>((_ *)local_f0,&local_100);
        kj::Maybe<kj::Own<const_kj::ReadableDirectory>_>::~Maybe(&local_100);
        pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_f0);
        if (pOVar5 == (Own<const_kj::ReadableDirectory> *)0x0) {
          kj::Maybe<const_kj::ReadableDirectory_&>::Maybe
                    ((Maybe<const_kj::ReadableDirectory_&> *)&pathStr_local.content.size_,
                     (void *)0x0);
          sdir._0_4_ = 1;
        }
        else {
          pOVar5 = kj::_::OwnOwn<const_kj::ReadableDirectory>::operator->
                             ((OwnOwn<const_kj::ReadableDirectory> *)local_f0);
          pRVar6 = kj::Own<const_kj::ReadableDirectory>::get(pOVar5);
          local_118 = pRVar6;
          pPVar7 = kj::mv<kj::Path>((Path *)local_58);
          kj::Path::Path(&local_130,pPVar7);
          pOVar5 = kj::_::OwnOwn<const_kj::ReadableDirectory>::operator*
                             ((OwnOwn<const_kj::ReadableDirectory> *)local_f0);
          pOVar5 = kj::mv<kj::Own<kj::ReadableDirectory_const>>(pOVar5);
          kj::Own<const_kj::ReadableDirectory>::Own
                    ((Own<const_kj::ReadableDirectory> *)&prefix.content.disposer,pOVar5);
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (&this->sourceDirectories,&local_130,(SourceDirectory *)&prefix.content.disposer
                    );
          SourceDirectory::~SourceDirectory((SourceDirectory *)&prefix.content.disposer);
          kj::Path::~Path(&local_130);
          kj::StringPtr::StringPtr((StringPtr *)(local_171 + 1),"/");
          bVar1 = kj::StringPtr::endsWith((StringPtr *)&this_local,(StringPtr *)(local_171 + 1));
          if (bVar1) {
            kj::str<kj::StringPtr&>((String *)local_160,(kj *)&this_local,params);
          }
          else {
            local_171[0] = 0x2f;
            kj::str<kj::StringPtr&,char>
                      ((String *)local_160,(kj *)&this_local,(StringPtr *)local_171,(char *)pRVar6);
          }
          pRVar6 = local_118;
          pSVar8 = kj::mv<kj::String>((String *)local_160);
          kj::String::String(&local_190,pSVar8);
          kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::insert
                    (&this->dirPrefixes,pRVar6,&local_190);
          kj::String::~String(&local_190);
          kj::Maybe<const_kj::ReadableDirectory_&>::Maybe
                    ((Maybe<const_kj::ReadableDirectory_&> *)&pathStr_local.content.size_,local_118)
          ;
          sdir._0_4_ = 1;
          kj::String::~String((String *)local_160);
        }
        kj::_::OwnOwn<const_kj::ReadableDirectory>::~OwnOwn
                  ((OwnOwn<const_kj::ReadableDirectory> *)local_f0);
      }
    }
    else {
      local_1c9 = 1;
      if ((local_80->isSourcePrefix & 1U) == 0) {
        local_1c9 = isSourcePrefix;
      }
      local_80->isSourcePrefix = (bool)(local_1c9 & 1);
      t = kj::Own<const_kj::ReadableDirectory>::operator*(&local_80->dir);
      kj::Maybe<const_kj::ReadableDirectory_&>::Maybe
                ((Maybe<const_kj::ReadableDirectory_&> *)&pathStr_local.content.size_,t);
      sdir._0_4_ = 1;
    }
  }
  kj::Path::~Path((Path *)local_58);
  return (Maybe<const_kj::ReadableDirectory_&>)(ReadableDirectory *)pathStr_local.content.size_;
}

Assistant:

kj::Maybe<const kj::ReadableDirectory&> getSourceDirectory(
      kj::StringPtr pathStr, bool isSourcePrefix) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    if (path.size() == 0) return disk->getRoot();

    KJ_IF_MAYBE(sdir, sourceDirectories.find(path)) {
      sdir->isSourcePrefix = sdir->isSourcePrefix || isSourcePrefix;
      return *sdir->dir;
    }

    if (path == cwd) {
      // Slight hack if the working directory is explicitly specified:
      // - We want to avoid opening a new copy of the working directory, as tryOpenSubdir() would
      //   do.
      // - If isSourcePrefix is true, we need to add it to sourceDirectories to track that.
      //   Otherwise we don't need to add it at all.
      // - We do not need to add it to dirPrefixes since the cwd is already handled in
      //   getDisplayName().
      auto& result = disk->getCurrent();
      if (isSourcePrefix) {
        kj::Own<const kj::ReadableDirectory> fakeOwn(&result, kj::NullDisposer::instance);
        sourceDirectories.insert(kj::mv(path), { kj::mv(fakeOwn), isSourcePrefix });
      }
      return result;
    }

    KJ_IF_MAYBE(dir, disk->getRoot().tryOpenSubdir(path)) {
      auto& result = *dir->get();
      sourceDirectories.insert(kj::mv(path), { kj::mv(*dir), isSourcePrefix });
#if _WIN32
      kj::String prefix = pathStr.endsWith("/") || pathStr.endsWith("\\")
                        ? kj::str(pathStr) : kj::str(pathStr, '\\');
#else
      kj::String prefix = pathStr.endsWith("/") ? kj::str(pathStr) : kj::str(pathStr, '/');
#endif
      dirPrefixes.insert(&result, kj::mv(prefix));
      return result;
    } else {
      return nullptr;
    }
  }